

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ControlFlowGraphBuilder.cpp
# Opt level: O1

vector<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_> *
AssemblyCode::buildControlFlowGraph
          (vector<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_>
           *__return_storage_ptr__,AssemblyCommands *commands)

{
  pointer *pppCVar1;
  _Rb_tree_header *p_Var2;
  long *plVar3;
  pointer pCVar4;
  iterator iVar5;
  bool bVar6;
  long lVar7;
  pointer psVar8;
  AbstractJumpCommand *this;
  mapped_type *pmVar9;
  long lVar10;
  ulong uVar11;
  CodeLine *pCVar12;
  long lVar13;
  ulong uVar14;
  CodeLine *labelJumpLine;
  CodeLine codeLine;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  labelToIndexMap;
  CodeLine *local_128;
  CodeLine *local_120;
  undefined1 local_118 [16];
  undefined1 local_108 [24];
  pointer local_f0;
  pointer ppCStack_e8;
  pointer local_e0;
  pointer ppCStack_d8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  bool local_70;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_60;
  
  buildLabelMap_abi_cxx11_
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              *)&local_60,commands);
  (__return_storage_ptr__->
  super__Vector_base<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psVar8 = (commands->
           super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((commands->
      super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != psVar8) {
    p_Var2 = &local_d0._M_impl.super__Rb_tree_header;
    lVar13 = 8;
    uVar14 = 0;
    do {
      local_118._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_d0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_e0 = (pointer)0x0;
      ppCStack_d8 = (pointer)0x0;
      local_f0 = (pointer)0x0;
      ppCStack_e8 = (pointer)0x0;
      local_108._8_8_ = (pointer)0x0;
      local_108._16_8_ = (pointer)0x0;
      local_d0._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_a0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_a0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_a0._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_a0._M_impl.super__Rb_tree_header._M_header;
      local_a0._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_108._0_4_ = (undefined4)uVar14;
      local_118._0_8_ = *(long *)((long)psVar8 + lVar13 + -8);
      local_d0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
      local_d0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
      local_a0._M_impl.super__Rb_tree_header._M_header._M_right =
           local_a0._M_impl.super__Rb_tree_header._M_header._M_left;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_118 + 8),
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&(psVar8->
                         super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr + lVar13));
      lVar7 = *(long *)((long)(commands->
                              super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + lVar13 + -8);
      if (lVar7 == 0) {
        local_70 = false;
      }
      else {
        lVar7 = __dynamic_cast(lVar7,&AssemblyCommand::typeinfo,&MoveRegRegCommand::typeinfo,0);
        local_70 = lVar7 != 0;
      }
      std::vector<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_>::push_back
                (__return_storage_ptr__,(value_type *)local_118);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_a0);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_d0);
      if (ppCStack_e8 != (pointer)0x0) {
        operator_delete(ppCStack_e8);
      }
      if ((pointer)local_108._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_108._8_8_);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
      }
      uVar14 = uVar14 + 1;
      psVar8 = (commands->
               super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar13 = lVar13 + 0x10;
    } while (uVar14 < (ulong)((long)(commands->
                                    super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)psVar8 >> 4)
            );
  }
  psVar8 = (commands->
           super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar13 = (long)(commands->
                 super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)psVar8;
  if (lVar13 != 0) {
    uVar11 = lVar13 >> 4;
    lVar13 = 0;
    lVar7 = 0;
    uVar14 = 1;
    do {
      lVar10 = *(long *)((long)&(psVar8->
                                super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>
                                )._M_ptr + lVar13);
      if (lVar10 == 0) {
        this = (AbstractJumpCommand *)0x0;
      }
      else {
        this = (AbstractJumpCommand *)
               __dynamic_cast(lVar10,&AssemblyCommand::typeinfo,&AbstractJumpCommand::typeinfo,0);
      }
      if (this == (AbstractJumpCommand *)0x0) {
        if (uVar14 != uVar11) {
          pCVar4 = (__return_storage_ptr__->
                   super__Vector_base<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          local_118._0_8_ =
               (long)&pCVar4[1].command.
                      super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr + lVar7;
          iVar5._M_current =
               *(CodeLine ***)
                ((long)&(pCVar4->nextLines).
                        super__Vector_base<AssemblyCode::CodeLine_*,_std::allocator<AssemblyCode::CodeLine_*>_>
                        ._M_impl + lVar7 + 8);
          if (iVar5._M_current ==
              *(CodeLine ***)
               ((long)&(pCVar4->nextLines).
                       super__Vector_base<AssemblyCode::CodeLine_*,_std::allocator<AssemblyCode::CodeLine_*>_>
                       ._M_impl + lVar7 + 0x10)) {
            std::vector<AssemblyCode::CodeLine*,std::allocator<AssemblyCode::CodeLine*>>::
            _M_realloc_insert<AssemblyCode::CodeLine*>
                      ((vector<AssemblyCode::CodeLine*,std::allocator<AssemblyCode::CodeLine*>> *)
                       ((long)&(pCVar4->nextLines).
                               super__Vector_base<AssemblyCode::CodeLine_*,_std::allocator<AssemblyCode::CodeLine_*>_>
                               ._M_impl + lVar7),iVar5,(CodeLine **)local_118);
          }
          else {
            *iVar5._M_current = (CodeLine *)local_118._0_8_;
            plVar3 = (long *)((long)&(pCVar4->nextLines).
                                     super__Vector_base<AssemblyCode::CodeLine_*,_std::allocator<AssemblyCode::CodeLine_*>_>
                                     ._M_impl + lVar7 + 8);
            *plVar3 = *plVar3 + 8;
          }
          pCVar4 = (__return_storage_ptr__->
                   super__Vector_base<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          local_118._0_8_ =
               (long)&(pCVar4->command).
                      super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr + lVar7;
          iVar5._M_current =
               *(CodeLine ***)
                ((long)&pCVar4[1].prevLines.
                        super__Vector_base<AssemblyCode::CodeLine_*,_std::allocator<AssemblyCode::CodeLine_*>_>
                        ._M_impl + lVar7 + 8);
          if (iVar5._M_current ==
              *(CodeLine ***)
               ((long)&pCVar4[1].prevLines.
                       super__Vector_base<AssemblyCode::CodeLine_*,_std::allocator<AssemblyCode::CodeLine_*>_>
                       ._M_impl + lVar7 + 0x10)) {
            std::vector<AssemblyCode::CodeLine*,std::allocator<AssemblyCode::CodeLine*>>::
            _M_realloc_insert<AssemblyCode::CodeLine*>
                      ((vector<AssemblyCode::CodeLine*,std::allocator<AssemblyCode::CodeLine*>> *)
                       ((long)&pCVar4[1].prevLines.
                               super__Vector_base<AssemblyCode::CodeLine_*,_std::allocator<AssemblyCode::CodeLine_*>_>
                               ._M_impl + lVar7),iVar5,(CodeLine **)local_118);
          }
          else {
            *iVar5._M_current = (CodeLine *)local_118._0_8_;
            pppCVar1 = &(((CodeLine *)(local_118._0_8_ + 0xb0))->prevLines).
                        super__Vector_base<AssemblyCode::CodeLine_*,_std::allocator<AssemblyCode::CodeLine_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            *pppCVar1 = *pppCVar1 + 1;
          }
        }
      }
      else {
        AbstractJumpCommand::getLabel_abi_cxx11_((string *)local_118,this);
        pmVar9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                               *)&local_60,(string *)local_118);
        pCVar12 = (__return_storage_ptr__->
                  super__Vector_base<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_>
                  )._M_impl.super__Vector_impl_data._M_start + *pmVar9;
        if ((CodeLine *)local_118._0_8_ != (CodeLine *)local_108) {
          operator_delete((void *)local_118._0_8_);
        }
        pCVar4 = (__return_storage_ptr__->
                 super__Vector_base<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        iVar5._M_current =
             *(CodeLine ***)
              ((long)&(pCVar4->nextLines).
                      super__Vector_base<AssemblyCode::CodeLine_*,_std::allocator<AssemblyCode::CodeLine_*>_>
                      ._M_impl + lVar7 + 8);
        local_128 = pCVar12;
        if (iVar5._M_current ==
            *(CodeLine ***)
             ((long)&(pCVar4->nextLines).
                     super__Vector_base<AssemblyCode::CodeLine_*,_std::allocator<AssemblyCode::CodeLine_*>_>
                     ._M_impl + lVar7 + 0x10)) {
          std::vector<AssemblyCode::CodeLine*,std::allocator<AssemblyCode::CodeLine*>>::
          _M_realloc_insert<AssemblyCode::CodeLine*const&>
                    ((vector<AssemblyCode::CodeLine*,std::allocator<AssemblyCode::CodeLine*>> *)
                     ((long)&(pCVar4->nextLines).
                             super__Vector_base<AssemblyCode::CodeLine_*,_std::allocator<AssemblyCode::CodeLine_*>_>
                             ._M_impl + lVar7),iVar5,&local_128);
        }
        else {
          *iVar5._M_current = pCVar12;
          plVar3 = (long *)((long)&(pCVar4->nextLines).
                                   super__Vector_base<AssemblyCode::CodeLine_*,_std::allocator<AssemblyCode::CodeLine_*>_>
                                   ._M_impl + lVar7 + 8);
          *plVar3 = *plVar3 + 8;
        }
        local_118._0_8_ =
             (long)&(((__return_storage_ptr__->
                      super__Vector_base<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_>
                      )._M_impl.super__Vector_impl_data._M_start)->command).
                    super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr + lVar7;
        iVar5._M_current =
             (local_128->prevLines).
             super__Vector_base<AssemblyCode::CodeLine_*,_std::allocator<AssemblyCode::CodeLine_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (local_128->prevLines).
            super__Vector_base<AssemblyCode::CodeLine_*,_std::allocator<AssemblyCode::CodeLine_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<AssemblyCode::CodeLine*,std::allocator<AssemblyCode::CodeLine*>>::
          _M_realloc_insert<AssemblyCode::CodeLine*>
                    ((vector<AssemblyCode::CodeLine*,std::allocator<AssemblyCode::CodeLine*>> *)
                     &local_128->prevLines,iVar5,(CodeLine **)local_118);
        }
        else {
          *iVar5._M_current = (CodeLine *)local_118._0_8_;
          pppCVar1 = &(local_128->prevLines).
                      super__Vector_base<AssemblyCode::CodeLine_*,_std::allocator<AssemblyCode::CodeLine_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppCVar1 = *pppCVar1 + 1;
        }
        lVar10 = __dynamic_cast(this,&AbstractJumpCommand::typeinfo,&JumpCommand::typeinfo,0);
        if ((lVar10 == 0) &&
           (uVar14 != (long)(commands->
                            super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(commands->
                            super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 4)) {
          pCVar4 = (__return_storage_ptr__->
                   super__Vector_base<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          local_118._0_8_ =
               (long)&pCVar4[1].command.
                      super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr + lVar7;
          iVar5._M_current =
               *(CodeLine ***)
                ((long)&(pCVar4->nextLines).
                        super__Vector_base<AssemblyCode::CodeLine_*,_std::allocator<AssemblyCode::CodeLine_*>_>
                        ._M_impl + lVar7 + 8);
          if (iVar5._M_current ==
              *(CodeLine ***)
               ((long)&(pCVar4->nextLines).
                       super__Vector_base<AssemblyCode::CodeLine_*,_std::allocator<AssemblyCode::CodeLine_*>_>
                       ._M_impl + lVar7 + 0x10)) {
            std::vector<AssemblyCode::CodeLine*,std::allocator<AssemblyCode::CodeLine*>>::
            _M_realloc_insert<AssemblyCode::CodeLine*const&>
                      ((vector<AssemblyCode::CodeLine*,std::allocator<AssemblyCode::CodeLine*>> *)
                       ((long)&(pCVar4->nextLines).
                               super__Vector_base<AssemblyCode::CodeLine_*,_std::allocator<AssemblyCode::CodeLine_*>_>
                               ._M_impl + lVar7),iVar5,(CodeLine **)local_118);
          }
          else {
            *iVar5._M_current = (CodeLine *)local_118._0_8_;
            plVar3 = (long *)((long)&(pCVar4->nextLines).
                                     super__Vector_base<AssemblyCode::CodeLine_*,_std::allocator<AssemblyCode::CodeLine_*>_>
                                     ._M_impl + lVar7 + 8);
            *plVar3 = *plVar3 + 8;
          }
          local_120 = (CodeLine *)
                      ((long)&(((__return_storage_ptr__->
                                super__Vector_base<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_>
                                )._M_impl.super__Vector_impl_data._M_start)->command).
                              super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr + lVar7);
          iVar5._M_current = *(pointer *)(local_118._0_8_ + 0x38);
          if (iVar5._M_current == *(pointer *)(local_118._0_8_ + 0x40)) {
            std::vector<AssemblyCode::CodeLine*,std::allocator<AssemblyCode::CodeLine*>>::
            _M_realloc_insert<AssemblyCode::CodeLine*>
                      ((vector<AssemblyCode::CodeLine*,std::allocator<AssemblyCode::CodeLine*>> *)
                       (local_118._0_8_ + 0x30),iVar5,&local_120);
          }
          else {
            *iVar5._M_current = local_120;
            *(pointer *)(local_118._0_8_ + 0x38) = *(pointer *)(local_118._0_8_ + 0x38) + 1;
          }
        }
      }
      psVar8 = (commands->
               super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar11 = (long)(commands->
                     super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)psVar8 >> 4;
      lVar7 = lVar7 + 0xb0;
      lVar13 = lVar13 + 0x10;
      bVar6 = uVar14 < uVar11;
      uVar14 = uVar14 + 1;
    } while (bVar6);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::vector<AssemblyCode::CodeLine> AssemblyCode::buildControlFlowGraph(const AssemblyCommands &commands) {
    std::map<std::string, int> labelToIndexMap = buildLabelMap(commands);
    std::vector<AssemblyCode::CodeLine> lines;

    // fill lines
    for (int i = 0; i < commands.size(); ++i) {
        CodeLine codeLine;
        codeLine.lineNumber = i;
        codeLine.command = commands[i];

        AssemblyCode::MoveRegRegCommand* moveRegRegCommand =
                dynamic_cast<AssemblyCode::MoveRegRegCommand*>(commands[i].get());

        codeLine.isMoveRegReg = moveRegRegCommand != nullptr;

        lines.push_back(codeLine);
    }

    // build graph
    for (int i = 0; i < commands.size(); ++i) {
        const AbstractJumpCommand* abstractJumpCommand = dynamic_cast<const AbstractJumpCommand*>(commands[i].get());
        if (abstractJumpCommand != nullptr) {
            CodeLine* labelJumpLine = &lines[labelToIndexMap[abstractJumpCommand->getLabel()]];

            lines[i].nextLines.push_back(labelJumpLine);
            labelJumpLine->prevLines.push_back(&lines[i]);

            const JumpCommand* jumpCommand = dynamic_cast<const JumpCommand*>(abstractJumpCommand);
            if (jumpCommand == nullptr && (i + 1) != commands.size()) {
                // conditional jump
                CodeLine* nextLine = &lines[i + 1];
                lines[i].nextLines.push_back(nextLine);
                nextLine->prevLines.push_back(&lines[i]);
            }
        } else {
            if ((i + 1) != commands.size()) {
                lines[i].nextLines.push_back(&lines[i + 1]);
                lines[i + 1].prevLines.push_back(&lines[i]);
            }
        }
    }

    return lines;
}